

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

bool llvm::AArch64::getArchFeatures
               (ArchKind AK,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *pvVar1;
  value_type local_98;
  value_type local_88;
  value_type local_78;
  value_type local_68;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *local_58;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features_local;
  char *pcStack_48;
  ArchKind AK_local;
  value_type *local_40;
  char *local_38;
  value_type *local_30;
  char *local_28;
  value_type *local_20;
  char *local_18;
  value_type *local_10;
  
  local_58 = Features;
  Features_local._4_4_ = AK;
  if (AK == ARMV8_1A) {
    local_40 = &local_68;
    pcStack_48 = "+v8.1a";
    local_68.Data = "+v8.1a";
    local_68.Length = strlen("+v8.1a");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_68);
  }
  pvVar1 = local_58;
  if (Features_local._4_4_ == ARMV8_2A) {
    local_30 = &local_78;
    local_38 = "+v8.2a";
    local_78.Data = "+v8.2a";
    local_78.Length = strlen("+v8.2a");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_78);
  }
  pvVar1 = local_58;
  if (Features_local._4_4_ == ARMV8_3A) {
    local_20 = &local_88;
    local_28 = "+v8.3a";
    local_88.Data = "+v8.3a";
    local_88.Length = strlen("+v8.3a");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_88);
  }
  pvVar1 = local_58;
  if (Features_local._4_4_ == ARMV8_4A) {
    local_10 = &local_98;
    local_18 = "+v8.4a";
    local_98.Data = "+v8.4a";
    local_98.Length = strlen("+v8.4a");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_98);
  }
  return Features_local._4_4_ != INVALID;
}

Assistant:

bool llvm::AArch64::getArchFeatures(AArch64::ArchKind AK,
                                    std::vector<StringRef> &Features) {
  if (AK == AArch64::ArchKind::ARMV8_1A)
    Features.push_back("+v8.1a");
  if (AK == AArch64::ArchKind::ARMV8_2A)
    Features.push_back("+v8.2a");
  if (AK == AArch64::ArchKind::ARMV8_3A)
    Features.push_back("+v8.3a");
  if (AK == AArch64::ArchKind::ARMV8_4A)
    Features.push_back("+v8.4a");

  return AK != AArch64::ArchKind::INVALID;
}